

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void kratos::check_non_synthesizable_content(Generator *top)

{
  UserException *this;
  undefined1 local_a0 [8];
  SynthesizableVisitor visitor;
  allocator<char> local_19;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a0 = (undefined1  [8])&PTR_visit_root_002ab3f8;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  IRVisitor::visit_root((IRVisitor *)local_a0,&top->super_IRNode);
  if (visitor.super_IRVisitor.visited_._M_h._M_single_bucket ==
      (__node_base_ptr)
      visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl
      .super__Vector_impl_data._M_start) {
    SynthesizableVisitor::~SynthesizableVisitor((SynthesizableVisitor *)local_a0);
    return;
  }
  print_nodes<kratos::IRNode*>
            ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
             &visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  this = (UserException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "Non-synthesizable content detected. Please see the relevant lines output above (after using debug mode)"
             ,&local_19);
  UserException::UserException
            (this,(string *)
                  &visitor.nodes_.
                   super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  __cxa_throw(this,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_non_synthesizable_content(Generator* top) {
    SynthesizableVisitor visitor;
    visitor.visit_root(top);
    auto const& nodes = visitor.nodes();
    if (!nodes.empty()) {
        print_nodes(nodes);
        throw UserException(
            "Non-synthesizable content detected. Please see the relevant lines "
            "output above (after using debug mode)");
    }
}